

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O0

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<TestBaseType>
          (Object_Data *this,shared_ptr<TestBaseType> *obj,bool t_return_value)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar1;
  element_type *local_50;
  undefined1 local_41;
  Any local_40;
  Any local_38 [3];
  undefined1 local_19;
  __shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2> *p_Stack_18;
  bool t_return_value_local;
  shared_ptr<TestBaseType> *obj_local;
  
  local_19 = t_return_value;
  p_Stack_18 = &obj->super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>;
  obj_local = (shared_ptr<TestBaseType> *)this;
  detail::Get_Type_Info<TestBaseType>::get();
  detail::Any::Any<std::shared_ptr<TestBaseType>const&,void>
            (&local_40,(shared_ptr<TestBaseType> *)p_Stack_18);
  local_41 = 0;
  local_50 = std::__shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>::get(p_Stack_18);
  std::
  make_shared<chaiscript::Boxed_Value::Data,chaiscript::Type_Info,chaiscript::detail::Any,bool,TestBaseType*,bool&>
            ((Type_Info *)this,local_38,(bool *)&local_40,(TestBaseType **)&local_41,
             (bool *)&local_50);
  detail::Any::~Any(&local_40);
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar1.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(const std::shared_ptr<T> &obj, bool t_return_value) {
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(obj), false, obj.get(), t_return_value);
      }